

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_recip(void *ptr,int nelem,int type)

{
  undefined1 auVar1 [16];
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  int i;
  float sd;
  float sc;
  float sx2;
  float sx1;
  float smagr;
  float smagi;
  double d;
  double c;
  double x2;
  double x1;
  double magr;
  double magi;
  Integer in_stack_000000e8;
  char *in_stack_000000f0;
  float local_b0;
  float local_ac;
  double local_a8;
  double local_a0;
  int local_5c;
  
  switch(in_EDX) {
  case 0x3e9:
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      if (*(int *)(in_RDI + (long)local_5c * 4) == 0) {
        pnga_error(in_stack_000000f0,in_stack_000000e8);
      }
      else {
        *(int *)(in_RDI + (long)local_5c * 4) =
             (int)(1 / (long)*(int *)(in_RDI + (long)local_5c * 4));
      }
    }
    break;
  case 0x3ea:
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      if (*(long *)(in_RDI + (long)local_5c * 8) == 0) {
        pnga_error(in_stack_000000f0,in_stack_000000e8);
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = SUB168(SEXT816(1),8);
        *(long *)(in_RDI + (long)local_5c * 8) =
             SUB168((auVar1 << 0x40 | ZEXT816(1)) / SEXT816(*(long *)(in_RDI + (long)local_5c * 8)),
                    0);
      }
    }
    break;
  case 0x3eb:
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      fVar3 = *(float *)(in_RDI + (long)local_5c * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        *(float *)(in_RDI + (long)local_5c * 4) = 1.0 / *(float *)(in_RDI + (long)local_5c * 4);
      }
      else {
        pnga_error(in_stack_000000f0,in_stack_000000e8);
      }
    }
    break;
  case 0x3ec:
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      dVar5 = *(double *)(in_RDI + (long)local_5c * 8);
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        *(double *)(in_RDI + (long)local_5c * 8) = 1.0 / *(double *)(in_RDI + (long)local_5c * 8);
      }
      else {
        pnga_error(in_stack_000000f0,in_stack_000000e8);
      }
    }
    break;
  default:
    pnga_error(in_stack_000000f0,in_stack_000000e8);
    break;
  case 0x3ee:
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      fVar3 = *(float *)(in_RDI + (long)local_5c * 8);
      fVar2 = *(float *)(in_RDI + 4 + (long)local_5c * 8);
      local_ac = fVar3;
      if (fVar3 < 0.0) {
        local_ac = -fVar3;
      }
      local_b0 = fVar2;
      if (fVar2 < 0.0) {
        local_b0 = -fVar2;
      }
      if (local_ac < local_b0) {
        fVar3 = fVar3 / fVar2;
        fVar2 = 1.0 / ((fVar3 * fVar3 + 1.0) * fVar2);
        *(float *)(in_RDI + (long)local_5c * 8) = fVar3 * fVar2;
        *(float *)(in_RDI + 4 + (long)local_5c * 8) = -fVar2;
      }
      else if ((local_ac != 0.0) || (NAN(local_ac))) {
        fVar2 = fVar2 / fVar3;
        fVar3 = 1.0 / ((fVar2 * fVar2 + 1.0) * fVar3);
        *(float *)(in_RDI + (long)local_5c * 8) = fVar3;
        *(float *)(in_RDI + 4 + (long)local_5c * 8) = -fVar2 * fVar3;
      }
      else {
        pnga_error(in_stack_000000f0,in_stack_000000e8);
      }
    }
    break;
  case 0x3ef:
    for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
      dVar5 = *(double *)(in_RDI + (long)local_5c * 0x10);
      dVar4 = *(double *)(in_RDI + (long)local_5c * 0x10 + 8);
      local_a0 = dVar5;
      if (dVar5 < 0.0) {
        local_a0 = -dVar5;
      }
      local_a8 = dVar4;
      if (dVar4 < 0.0) {
        local_a8 = -dVar4;
      }
      if (local_a0 < local_a8) {
        dVar5 = dVar5 / dVar4;
        dVar4 = 1.0 / ((dVar5 * dVar5 + 1.0) * dVar4);
        *(double *)(in_RDI + (long)local_5c * 0x10) = dVar5 * dVar4;
        *(double *)(in_RDI + (long)local_5c * 0x10 + 8) = -dVar4;
      }
      else if ((local_a0 != 0.0) || (NAN(local_a0))) {
        dVar4 = dVar4 / dVar5;
        dVar5 = 1.0 / ((dVar4 * dVar4 + 1.0) * dVar5);
        *(double *)(in_RDI + (long)local_5c * 0x10) = dVar5;
        *(double *)(in_RDI + (long)local_5c * 0x10 + 8) = -dVar4 * dVar5;
      }
      else {
        pnga_error(in_stack_000000f0,in_stack_000000e8);
      }
    }
  }
  return;
}

Assistant:

static void do_recip(void *ptr, int nelem, int type)
{
  /*
    DJB general comment, as I found this routine, it
    would return some form of infinity when having 
    a zero denominator. I find that technically incorrect
    and the commented out error message to be preferrable.
    If returning infinity is the behavior desired I would recommend
    having a separate specialized reciprocal, where it's
    in the GA documentation, what should happen on a divide
    by zero. In IEEE standard, the default is to throw
    a floating point exception (FPE) when division by zero
    occurs. The ga_error message seems to be the
    moral equivalent of that.
    I have commented out the Infinity returns and returned 
    to the ga_error calls. Also on the commented out 
    infinity value returns I have been more specific in
    the INFINITY type returned (the trailing _*).
  */
  double magi, magr, x1, x2, c, d;
  float smagi, smagr, sx1, sx2, sc, sd;
    int i;
    switch (type){
         int *ia;
         double *da; /*, temp; */
         float *fa;
         DoubleComplex *ca;
         SingleComplex *cfa;
         long *la; 

         case C_INT:
              ia = (int *)ptr;
              for(i=0;i<nelem;i++)
                  if(ia[i]!=0) ia[i]= 1/ia[i];
                     else
                   pnga_error("zero value at index",i);
		       /*
			 ia[i] = GA_INFINITY_I;
		       */
              break;
         case C_DCPL:
              ca = (DoubleComplex *) ptr;
              for(i=0;i<nelem;i++){
		/* 
		  Again, as for absolute value the following
		  algorithm can lead to unecessary overflow/underflow
		   
                  temp = ca[i].real*ca[i].real + ca[i].imag*ca[i].imag;
                  if( temp!=0.0){
                   ca[i].real =ca[i].real/temp;
                   ca[i].imag =-ca[i].imag/temp;
                  }
                  else{
 		     pnga_error("zero value at index",i); 
                     OR
		       ca[i].real = GA_INFINITY_D;
		       ca[i].imag = GA_INFINITY_D;

                 }
		 Better (but slower) is: 
	       */		     
		x1 = ca[i].real;
		x2 = ca[i].imag;
		/*
		printf(" do_recip i = %d, x1 = %le, x2 = %le\n",
		       i,x1,x2);
		*/
		magr = GA_ABS(x1);
		magi = GA_ABS(x2);
		/*
		printf(" do_recip i = %d, magr = %le, magi = %le\n",
		       i,magr,magi);
		*/
		if (magr >= magi) {
		  if (magr != ((double)0.0)) {
		    c = x2/x1;
		    d = ((double)1.0)/((((double)1.0) + (c*c))*x1);
		    ca[i].real = d;
		    ca[i].imag = -c*d;
		  } else {
		    pnga_error("zero value at index",i); 
		  }
		} else {
		  c = x1/x2;
		  d = ((double)1.0)/((((double)1.0) + (c*c))*x2);
		  ca[i].real = c*d;
		  ca[i].imag = -d;
		}
                /*
		printf(" do_recip ca[%d].real = %le, ca[%d].imag = %le\n",
		       i,ca[i].real,i,ca[i].imag);
		*/

	      }
              break;
         case C_SCPL:
              cfa = (SingleComplex *) ptr;
              for(i=0;i<nelem;i++){
		/* 
		  Again, as for absolute value the following
		  algorithm can lead to unecessary overflow/underflow
		   
                  temp = cfa[i].real*cfa[i].real + cfa[i].imag*cfa[i].imag;
                  if( temp!=0.0){
                   cfa[i].real =cfa[i].real/temp;
                   cfa[i].imag =-cfa[i].imag/temp;
                  }
                  else{
 		     pnga_error("zero value at index",i); 
                     OR
		       cfa[i].real = GA_INFINITY_D;
		       cfa[i].imag = GA_INFINITY_D;

                 }
		 Better (but slower) is: 
	       */		     
		sx1 = cfa[i].real;
		sx2 = cfa[i].imag;
		/*
		printf(" do_recip i = %d, x1 = %le, x2 = %le\n",
		       i,x1,x2);
		*/
		smagr = GA_ABS(sx1);
		smagi = GA_ABS(sx2);
		/*
		printf(" do_recip i = %d, magr = %le, magi = %le\n",
		       i,magr,magi);
		*/
		if (smagr >= smagi) {
		  if (smagr != ((float)0.0)) {
		    sc = sx2/sx1;
		    sd = ((float)1.0)/((((float)1.0) + (sc*sc))*sx1);
		    cfa[i].real = sd;
		    cfa[i].imag = -sc*sd;
		  } else {
		    pnga_error("zero value at index",i); 
		  }
		} else {
		  sc = sx1/sx2;
		  sd = ((float)1.0)/((((float)1.0) + (sc*sc))*sx2);
		  cfa[i].real = sc*sd;
		  cfa[i].imag = -sd;
		}
                /*
		printf(" do_recip ca[%d].real = %le, ca[%d].imag = %le\n",
		       i,ca[i].real,i,ca[i].imag);
		*/

	      }
              break;
         case C_DBL:
              da = (double *) ptr;
              for(i=0;i<nelem;i++)
                  if(da[i]!=(double)0.0) da[i]= ((double)1.0)/da[i];
  		     else
		   pnga_error("zero value at index",i); 
		    /* 
		       da[i] = GA_INFINITY_D;
		    */
              break;
         case C_FLOAT:
              fa = (float *)ptr;
              for(i=0;i<nelem;i++)
                  if(fa[i]!=(float)0.0) fa[i]= ((float)1.0)/fa[i];
                     else
		   pnga_error("zero value at index",i); 
         	   /*
		     fa[i] = GA_INFINITY_F
		   */;
              break;
	case C_LONG:
              la = (long *)ptr;
              for(i=0;i<nelem;i++)
                  if(la[i]!=(long)0) la[i]= ((long)1)/la[i];
                     else
                  pnga_error("zero value at index",i); 
	          /*
		    la[i] = GA_INFINITY_I;
		  */
              break;


         default: pnga_error("wrong data type",type);
    }
}